

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_rbtree.c
# Opt level: O3

ngx_rbtree_node_t * ngx_rbtree_next(ngx_rbtree_t *tree,ngx_rbtree_node_t *node)

{
  ngx_rbtree_node_t *pnVar1;
  ngx_rbtree_node_t *pnVar2;
  bool bVar3;
  
  pnVar1 = node->right;
  if (node->right == tree->sentinel) {
    do {
      if (node == tree->root) {
        return (ngx_rbtree_node_t *)0x0;
      }
      pnVar2 = node->parent;
      bVar3 = node != pnVar2->left;
      node = pnVar2;
    } while (bVar3);
  }
  else {
    do {
      pnVar2 = pnVar1;
      pnVar1 = pnVar2->left;
    } while (pnVar2->left != tree->sentinel);
  }
  return pnVar2;
}

Assistant:

ngx_rbtree_node_t *
ngx_rbtree_next(ngx_rbtree_t *tree, ngx_rbtree_node_t *node)
{
    ngx_rbtree_node_t  *root, *sentinel, *parent;

    sentinel = tree->sentinel;

    if (node->right != sentinel) {
        return ngx_rbtree_min(node->right, sentinel);
    }

    root = tree->root;

    for ( ;; ) {
        parent = node->parent;

        if (node == root) {
            return NULL;
        }

        if (node == parent->left) {
            return parent;
        }

        node = parent;
    }
}